

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  int i;
  int n;
  
  for (n = 0; n != (ctx->Tables).Map.Data.Size; n = n + 1) {
    pIVar1 = ImPool<ImGuiTable>::TryGetMapData(&ctx->Tables,n);
    if (pIVar1 != (ImGuiTable *)0x0) {
      pIVar1->IsSettingsRequestLoad = true;
      pIVar1->SettingsOffset = -1;
    }
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
        {
            table->IsSettingsRequestLoad = true;
            table->SettingsOffset = -1;
        }
}